

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opj_decompress.c
# Opt level: O2

int parse_cmdline_decoder
              (int argc,char **argv,opj_decompress_parameters *parameters,img_fol_t *img_fol)

{
  FILE *__stream;
  img_fol_t *piVar1;
  char **ppcVar2;
  int iVar3;
  OPJ_UINT32 OVar4;
  uint uVar5;
  OPJ_UINT32 OVar6;
  OPJ_UINT32 *__ptr;
  char *pcVar7;
  opj_precision *poVar8;
  size_t sVar9;
  undefined8 uVar10;
  opj_precision_mode oVar11;
  uint *src;
  uint *extraout_RDX;
  uint *extraout_RDX_00;
  ulong uVar12;
  opj_decompress_parameters *poVar13;
  char cVar14;
  char *pcVar15;
  int *__s;
  size_t sStack_220;
  char mode;
  char local_20d;
  int local_20c;
  int *local_208;
  char *local_200;
  img_fol_t *local_1f8;
  int local_1ec;
  opj_decompress_parameters *local_1e8;
  char *local_1e0;
  char **local_1d8;
  OPJ_UINT32 *local_1d0;
  OPJ_UINT32 *local_1c8;
  OPJ_UINT32 *local_1c0;
  OPJ_UINT32 *local_1b8;
  opj_decompress_parameters *local_1b0;
  OPJ_UINT32 *local_1a8;
  char *local_1a0;
  char optlist [20];
  int prec;
  opj_option_t long_option [8];
  
  local_1ec = argc;
  local_1d8 = argv;
  memcpy(long_option,&PTR_anon_var_dwarf_264_00118b80,0x100);
  builtin_strncpy(optlist,"i:o:r:l:x:d:t:p:c:h",0x14);
  long_option[2].flag = &parameters->force_rgb;
  long_option[3].flag = &parameters->upsample;
  long_option[4].flag = &parameters->split_pnm;
  long_option[6].flag = &parameters->quiet;
  long_option[7].flag = &parameters->allow_partial;
  opj_reset_options_reading();
  img_fol->set_out_format = '\0';
  local_1e8 = (opj_decompress_parameters *)&parameters->num_threads;
  local_1a0 = parameters->indexfilename;
  local_1a8 = &parameters->tile_index;
  local_1b8 = &parameters->DA_x0;
  local_1c0 = &parameters->DA_y0;
  local_1c8 = &parameters->DA_x1;
  local_1d0 = &parameters->DA_y1;
  local_1b0 = (opj_decompress_parameters *)&(parameters->core).cp_layer;
  local_200 = parameters->outfile;
  local_1e0 = parameters->infile;
  local_20c = 1;
  local_1f8 = img_fol;
LAB_00103e49:
  do {
    iVar3 = opj_getopt_long(local_1ec,local_1d8,optlist,long_option,0x100);
    ppcVar2 = local_1d8;
    __stream = _stdout;
    __s = (int *)opj_optarg;
    src = &switchD_00103e83::switchdataD_00112010;
    switch(iVar3) {
    case 99:
      OVar6 = parameters->numcomps;
      __ptr = parameters->comps_indices;
      pcVar15 = opj_optarg;
      do {
        parameters->numcomps = OVar6 + 1;
        __ptr = (OPJ_UINT32 *)realloc(__ptr,(ulong)(OVar6 + 1) << 2);
        parameters->comps_indices = __ptr;
        OVar4 = atoi(pcVar15);
        OVar6 = parameters->numcomps;
        __ptr[OVar6 - 1] = OVar4;
        pcVar7 = strchr(pcVar15,0x2c);
        pcVar15 = pcVar7 + 1;
      } while (pcVar7 != (char *)0x0);
      goto LAB_00103e49;
    case 100:
      sVar9 = strlen(opj_optarg);
      pcVar15 = (char *)malloc(sVar9 + 1);
      if (pcVar15 == (char *)0x0) {
        pcVar15 = "[ERROR] Couldn\'t allocate memory\n";
        sStack_220 = 0x21;
        goto LAB_0010430e;
      }
      *pcVar15 = '\0';
      memcpy(pcVar15,__s,sVar9 + 1);
      parse_DA_values(pcVar15,local_1b8,local_1c0,local_1c8,local_1d0);
      free(pcVar15);
      goto LAB_00103e49;
    case 0x65:
    case 0x66:
    case 0x67:
    case 0x6a:
    case 0x6b:
    case 0x6d:
    case 0x6e:
    case 0x71:
    case 0x73:
    case 0x75:
    case 0x76:
    case 0x77:
      goto switchD_00103e83_caseD_65;
    case 0x68:
      uVar10 = opj_version();
      fprintf(__stream,
              "\nThis is the opj_decompress utility from the OpenJPEG project.\nIt decompresses JPEG 2000 codestreams to various image formats.\nIt has been compiled against openjp2 library v%s.\n\n"
              ,uVar10);
      fwrite("Parameters:\n-----------\n\n  -ImgDir <directory> \n\tImage file Directory path \n  -OutFor <PBM|PGM|PPM|PNM|PAM|PGX|PNG|BMP|TIF|TIFF|RAW|YUV|RAWL|TGA>\n    REQUIRED only if -ImgDir is used\n\tOutput format for decompressed images.\n"
             ,0xdf,1,_stdout);
      fwrite("  -i <compressed file>\n    REQUIRED only if an Input image directory is not specified\n    Currently accepts J2K-files, JP2-files and JPT-files. The file type\n    is identified based on its suffix.\n"
             ,0xc5,1,_stdout);
      fwrite("  -o <decompressed file>\n    REQUIRED\n    Currently accepts formats specified above (see OutFor option)\n    Binary data is written to the file (not ascii). If a PGX\n    filename is given, there will be as many output files as there are\n    components: an indice starting from 0 will then be appended to the\n    output filename, just before the \"pgx\" extension. If a PGM filename\n    is given and there are more than one component, only the first component\n    will be written to the file.\n"
             ,0x1e9,1,_stdout);
      fwrite("  -r <reduce factor>\n    Set the number of highest resolution levels to be discarded. The\n    image resolution is effectively divided by 2 to the power of the\n    number of discarded levels. The reduce factor is limited by the\n    smallest total number of decomposition levels among tiles.\n  -l <number of quality layers to decode>\n    Set the maximum number of quality layers to decode. If there are\n    less quality layers than the specified number, all the quality layers\n    are decoded.\n"
             ,0x1ec,1,_stdout);
      fwrite("  -x  \n    Create an index file *.Idx (-x index_name.Idx) \n  -d <x0,y0,x1,y1>\n    OPTIONAL\n    Decoding area\n    By default all the image is decoded.\n  -t <tile_number>\n    OPTIONAL\n    Set the tile number of the decoded tile. Follow the JPEG2000 convention from left-up to bottom-up\n    By default all tiles are decoded.\n"
             ,0x142,1,_stdout);
      fwrite("  -p <comp 0 precision>[C|S][,<comp 1 precision>[C|S][,...]]\n    OPTIONAL\n    Force the precision (bit depth) of components.\n"
             ,0x7d,1,_stdout);
      fwrite("    There shall be at least 1 value. There is no limit on the number of values (comma separated, last values ignored if too much values).\n    If there are less values than components, the last value is used for remaining components.\n    If \'C\' is specified (default), values are clipped.\n    If \'S\' is specified, values are scaled.\n    A 0 value can be specified (meaning original bit depth).\n"
             ,0x189,1,_stdout);
      fwrite("  -c first_comp_index[,second_comp_index][,...]\n    OPTIONAL\n    To limit the number of components to decoded.\n    Component indices are numbered starting at 0.\n"
             ,0xa1,1,_stdout);
      fwrite("  -force-rgb\n    Force output image colorspace to RGB\n  -upsample\n    Downsampled components will be upsampled to image size\n  -split-pnm\n    Split output components to different files when writing to PNM\n"
             ,0xcd,1,_stdout);
      iVar3 = opj_has_thread_support();
      if (iVar3 != 0) {
        fwrite("  -threads <num_threads|ALL_CPUS>\n    Number of threads to use for decoding or ALL_CPUS for all available cores.\n"
               ,0x71,1,_stdout);
      }
      fwrite("  -allow-partial\n    Disable strict mode to allow decoding partial codestreams.\n",
             0x50,1,_stdout);
      fwrite("  -quiet\n    Disable output from the library and other output.\n",0x3f,1,_stdout);
      fputc(10,_stdout);
      return local_20c;
    case 0x69:
      uVar5 = infile_format(opj_optarg);
      parameters->decod_format = uVar5;
      src = extraout_RDX_00;
      pcVar15 = local_1e0;
      if (2 < uVar5) {
        if (uVar5 == 0xfffffffe) {
          pcVar15 = "!! infile cannot be read: %s !!\n\n";
        }
        else {
          pcVar15 = 
          "[ERROR] Unknown input file format: %s \n        Known file formats are *.j2k, *.jp2, *.jpc or *.jpt\n"
          ;
        }
LAB_0010464c:
        fprintf(_stderr,pcVar15,__s);
        return local_20c;
      }
      break;
    case 0x6c:
      pcVar15 = "%u";
      poVar13 = local_1b0;
      goto LAB_001041dc;
    case 0x6f:
      uVar5 = get_file_format(opj_optarg);
      parameters->cod_format = uVar5;
      if ((0x12 < uVar5) ||
         (src = extraout_RDX, pcVar15 = local_200, (0x7dc00U >> (uVar5 & 0x1f) & 1) == 0)) {
        pcVar15 = 
        "Unknown output format image %s [only *.png, *.pnm, *.pgm, *.ppm, *.pgx, *.bmp, *.tif(f), *.raw, *.yuv or *.tga]!!\n"
        ;
        goto LAB_0010464c;
      }
      break;
    case 0x70:
      if (parameters->precision != (opj_precision *)0x0) {
        free(parameters->precision);
        parameters->precision = (opj_precision *)0x0;
      }
      parameters->nb_precision = 0;
      local_208 = __s;
      do {
        iVar3 = __isoc99_sscanf(__s,"%d%c%c",&prec,&mode,&local_20d);
        OVar6 = prec;
        if (iVar3 == 1) {
LAB_0010404a:
          mode = 'C';
LAB_00104052:
          local_20d = ',';
        }
        else {
          if (mode == ',' || iVar3 == 2) {
            if (mode == ',') goto LAB_0010404a;
            goto LAB_00104052;
          }
          if (iVar3 != 3) {
            pcVar15 = "Could not parse precision option %s\n";
            __s = local_208;
            goto LAB_0010464c;
          }
        }
        cVar14 = mode;
        if (prec - 0x21U < 0xffffffe0) {
          pcVar15 = "Invalid precision %d in precision option %s\n";
          uVar12 = (ulong)(uint)prec;
LAB_00104353:
          fprintf(_stderr,pcVar15,uVar12,local_208);
          return local_20c;
        }
        if ((mode & 0xefU) != 0x43) {
          uVar12 = (ulong)(uint)(int)mode;
          pcVar15 = "Invalid precision mode %c in precision option %s\n";
          goto LAB_00104353;
        }
        uVar12 = (ulong)(uint)(int)local_20d;
        if ((int)local_20d != 0x2c) {
          pcVar15 = "Invalid character %c in precision option %s\n";
          goto LAB_00104353;
        }
        if (parameters->precision == (opj_precision *)0x0) {
          poVar8 = (opj_precision *)malloc(8);
          parameters->precision = poVar8;
          if (poVar8 == (opj_precision *)0x0) {
LAB_001042f7:
            pcVar15 = "Could not allocate memory for precision option\n";
            sStack_220 = 0x2f;
            goto LAB_0010430e;
          }
        }
        else {
          uVar5 = parameters->nb_precision + 1;
          if ((uVar5 == 0) ||
             (poVar8 = (opj_precision *)realloc(parameters->precision,(ulong)uVar5 << 3),
             poVar8 == (opj_precision *)0x0)) goto LAB_001042f7;
          parameters->precision = poVar8;
          cVar14 = mode;
          OVar6 = prec;
        }
        uVar5 = parameters->nb_precision;
        poVar8[uVar5].prec = OVar6;
        if (cVar14 == 'C') {
          oVar11 = OPJ_PREC_MODE_CLIP;
LAB_00104135:
          poVar8[uVar5].mode = oVar11;
        }
        else if (cVar14 == 'S') {
          oVar11 = OPJ_PREC_MODE_SCALE;
          goto LAB_00104135;
        }
        parameters->nb_precision = uVar5 + 1;
        pcVar15 = strchr((char *)__s,0x2c);
        if (pcVar15 == (char *)0x0) goto LAB_00103e49;
        __s = (int *)(pcVar15 + 1);
      } while( true );
    case 0x72:
      pcVar15 = "%u";
      poVar13 = parameters;
LAB_001041dc:
      __isoc99_sscanf(__s,pcVar15,poVar13);
      goto LAB_00103e49;
    case 0x74:
      __isoc99_sscanf(opj_optarg,"%u",local_1a8);
      parameters->nb_tile_to_decode = 1;
      goto LAB_00103e49;
    case 0x78:
      pcVar15 = local_1a0;
      break;
    case 0x79:
      sVar9 = strlen(opj_optarg);
      pcVar15 = (char *)malloc(sVar9 + 1);
      piVar1 = local_1f8;
      local_1f8->imgdirpath = pcVar15;
      if (pcVar15 == (char *)0x0) {
        return local_20c;
      }
      strcpy(pcVar15,opj_optarg);
      piVar1->set_imgdir = '\x01';
      goto LAB_00103e49;
    default:
      if (iVar3 != 0) {
        if (iVar3 == 0x4f) {
          sprintf((char *)&prec,".%s",opj_optarg);
          piVar1 = local_1f8;
          local_1f8->set_out_format = '\x01';
          iVar3 = get_file_format((char *)&prec);
          parameters->cod_format = iVar3;
          uVar5 = iVar3 - 10;
          if ((8 < uVar5) || ((0x1f7U >> (uVar5 & 0x1f) & 1) == 0)) {
            pcVar15 = 
            "Unknown output format image %s [only *.png, *.pnm, *.pgm, *.ppm, *.pgx, *.bmp, *.tif(f), *.raw, *.yuv or *.tga]!!\n"
            ;
            __s = &prec;
            goto LAB_0010464c;
          }
          piVar1->out_format = &DAT_0011213c + *(int *)(&DAT_0011213c + (ulong)uVar5 * 4);
        }
        else if (iVar3 == 0x54) {
          iVar3 = strcmp(opj_optarg,"ALL_CPUS");
          if (iVar3 != 0) {
            pcVar15 = "%d";
            poVar13 = local_1e8;
            goto LAB_001041dc;
          }
          OVar6 = opj_get_num_cpus();
          if (OVar6 == 1) {
            OVar6 = 0;
          }
          (local_1e8->core).cp_reduce = OVar6;
        }
        else {
          if (iVar3 == -1) {
            if (local_1f8->set_imgdir != '\x01') {
              if ((*local_1e0 != '\0') && (*local_200 != '\0')) {
                return 0;
              }
              fprintf(_stderr,
                      "[ERROR] Required parameters are missing\nExample: %s -i image.j2k -o image.pgm\n"
                      ,*local_1d8);
              pcVar15 = "   Help: %s -h\n";
              __s = (int *)*ppcVar2;
              goto LAB_0010464c;
            }
            if (*local_1e0 == '\0') {
              if (local_1f8->set_out_format == '\0') {
                fwrite("[ERROR] When -ImgDir is used, -OutFor <FORMAT> must be used.\n",0x3d,1,
                       _stderr);
                pcVar15 = 
                "Only one format allowed.\nValid format are PGM, PPM, PNM, PGX, BMP, TIF, TIFF, RAW, YUV, and TGA.\n"
                ;
                sStack_220 = 0x61;
                goto LAB_0010430e;
              }
              if (*local_200 == '\0') {
                return 0;
              }
              pcVar15 = "[ERROR] options -ImgDir and -o cannot be used together.\n";
            }
            else {
              pcVar15 = "[ERROR] options -ImgDir and -i cannot be used together.\n";
            }
            sStack_220 = 0x38;
            goto LAB_0010430e;
          }
switchD_00103e83_caseD_65:
          fwrite("[WARNING] An invalid option has been ignored.\n",0x2e,1,_stderr);
        }
      }
      goto LAB_00103e49;
    }
    iVar3 = opj_strcpy_s(pcVar15,(size_t)__s,(char *)src);
    if (iVar3 != 0) {
      pcVar15 = "[ERROR] Path is too long\n";
      sStack_220 = 0x19;
LAB_0010430e:
      fwrite(pcVar15,sStack_220,1,_stderr);
      return local_20c;
    }
  } while( true );
}

Assistant:

int parse_cmdline_decoder(int argc, char **argv,
                          opj_decompress_parameters *parameters, img_fol_t *img_fol)
{
    /* parse the command line */
    int totlen, c;
    opj_option_t long_option[] = {
        {"ImgDir",    REQ_ARG, NULL, 'y'},
        {"OutFor",    REQ_ARG, NULL, 'O'},
        {"force-rgb", NO_ARG,  NULL, 1},
        {"upsample",  NO_ARG,  NULL, 1},
        {"split-pnm", NO_ARG,  NULL, 1},
        {"threads",   REQ_ARG, NULL, 'T'},
        {"quiet", NO_ARG,  NULL, 1},
        {"allow-partial", NO_ARG,  NULL, 1},
    };

    const char optlist[] = "i:o:r:l:x:d:t:p:c:"

                           /* UniPG>> */
#ifdef USE_JPWL
                           "W:"
#endif /* USE_JPWL */
                           /* <<UniPG */
                           "h"     ;

    long_option[2].flag = &(parameters->force_rgb);
    long_option[3].flag = &(parameters->upsample);
    long_option[4].flag = &(parameters->split_pnm);
    long_option[6].flag = &(parameters->quiet);
    long_option[7].flag = &(parameters->allow_partial);
    totlen = sizeof(long_option);
    opj_reset_options_reading();
    img_fol->set_out_format = 0;
    do {
        c = opj_getopt_long(argc, argv, optlist, long_option, totlen);
        if (c == -1) {
            break;
        }
        switch (c) {
        case 0: /* long opt with flag */
            break;
        case 'i': {         /* input file */
            char *infile = opj_optarg;
            parameters->decod_format = infile_format(infile);
            switch (parameters->decod_format) {
            case J2K_CFMT:
                break;
            case JP2_CFMT:
                break;
            case JPT_CFMT:
                break;
            case -2:
                fprintf(stderr,
                        "!! infile cannot be read: %s !!\n\n",
                        infile);
                return 1;
            default:
                fprintf(stderr,
                        "[ERROR] Unknown input file format: %s \n"
                        "        Known file formats are *.j2k, *.jp2, *.jpc or *.jpt\n",
                        infile);
                return 1;
            }
            if (opj_strcpy_s(parameters->infile, sizeof(parameters->infile), infile) != 0) {
                fprintf(stderr, "[ERROR] Path is too long\n");
                return 1;
            }
        }
        break;

        /* ----------------------------------------------------- */

        case 'o': {         /* output file */
            char *outfile = opj_optarg;
            parameters->cod_format = get_file_format(outfile);
            switch (parameters->cod_format) {
            case PGX_DFMT:
            case PXM_DFMT:
            case BMP_DFMT:
            case TIF_DFMT:
            case RAW_DFMT:
            case RAWL_DFMT:
            case TGA_DFMT:
            case PNG_DFMT:
                break;
            default:
                fprintf(stderr,
                        "Unknown output format image %s [only *.png, *.pnm, *.pgm, *.ppm, *.pgx, *.bmp, *.tif(f), *.raw, *.yuv or *.tga]!!\n",
                        outfile);
                return 1;
            }
            if (opj_strcpy_s(parameters->outfile, sizeof(parameters->outfile),
                             outfile) != 0) {
                fprintf(stderr, "[ERROR] Path is too long\n");
                return 1;
            }
        }
        break;

        /* ----------------------------------------------------- */

        case 'O': {         /* output format */
            char outformat[50];
            char *of = opj_optarg;
            sprintf(outformat, ".%s", of);
            img_fol->set_out_format = 1;
            parameters->cod_format = get_file_format(outformat);
            switch (parameters->cod_format) {
            case PGX_DFMT:
                img_fol->out_format = "pgx";
                break;
            case PXM_DFMT:
                img_fol->out_format = "ppm";
                break;
            case BMP_DFMT:
                img_fol->out_format = "bmp";
                break;
            case TIF_DFMT:
                img_fol->out_format = "tif";
                break;
            case RAW_DFMT:
                img_fol->out_format = "raw";
                break;
            case RAWL_DFMT:
                img_fol->out_format = "rawl";
                break;
            case TGA_DFMT:
                img_fol->out_format = "raw";
                break;
            case PNG_DFMT:
                img_fol->out_format = "png";
                break;
            default:
                fprintf(stderr,
                        "Unknown output format image %s [only *.png, *.pnm, *.pgm, *.ppm, *.pgx, *.bmp, *.tif(f), *.raw, *.yuv or *.tga]!!\n",
                        outformat);
                return 1;
                break;
            }
        }
        break;

        /* ----------------------------------------------------- */


        case 'r': {     /* reduce option */
            sscanf(opj_optarg, "%u", &(parameters->core.cp_reduce));
        }
        break;

        /* ----------------------------------------------------- */


        case 'l': {     /* layering option */
            sscanf(opj_optarg, "%u", &(parameters->core.cp_layer));
        }
        break;

        /* ----------------------------------------------------- */

        case 'h':           /* display an help description */
            decode_help_display();
            return 1;

        /* ----------------------------------------------------- */

        case 'y': {         /* Image Directory path */
            img_fol->imgdirpath = (char*)malloc(strlen(opj_optarg) + 1);
            if (img_fol->imgdirpath == NULL) {
                return 1;
            }
            strcpy(img_fol->imgdirpath, opj_optarg);
            img_fol->set_imgdir = 1;
        }
        break;

        /* ----------------------------------------------------- */

        case 'd': {         /* Input decode ROI */
            size_t size_optarg = (size_t)strlen(opj_optarg) + 1U;
            char *ROI_values = (char*) malloc(size_optarg);
            if (ROI_values == NULL) {
                fprintf(stderr, "[ERROR] Couldn't allocate memory\n");
                return 1;
            }
            ROI_values[0] = '\0';
            memcpy(ROI_values, opj_optarg, size_optarg);
            /*printf("ROI_values = %s [%d / %d]\n", ROI_values, strlen(ROI_values), size_optarg ); */
            parse_DA_values(ROI_values, &parameters->DA_x0, &parameters->DA_y0,
                            &parameters->DA_x1, &parameters->DA_y1);

            free(ROI_values);
        }
        break;

        /* ----------------------------------------------------- */

        case 't': {         /* Input tile index */
            sscanf(opj_optarg, "%u", &parameters->tile_index);
            parameters->nb_tile_to_decode = 1;
        }
        break;

        /* ----------------------------------------------------- */

        case 'x': {         /* Creation of index file */
            if (opj_strcpy_s(parameters->indexfilename, sizeof(parameters->indexfilename),
                             opj_optarg) != 0) {
                fprintf(stderr, "[ERROR] Path is too long\n");
                return 1;
            }
        }
        break;

        /* ----------------------------------------------------- */
        case 'p': { /* Force precision */
            if (!parse_precision(opj_optarg, parameters)) {
                return 1;
            }
        }
        break;

        /* ----------------------------------------------------- */
        case 'c': { /* Components */
            const char* iter = opj_optarg;
            while (1) {
                parameters->numcomps ++;
                parameters->comps_indices = (OPJ_UINT32*) realloc(
                                                parameters->comps_indices,
                                                parameters->numcomps * sizeof(OPJ_UINT32));
                parameters->comps_indices[parameters->numcomps - 1] =
                    (OPJ_UINT32) atoi(iter);
                iter = strchr(iter, ',');
                if (iter == NULL) {
                    break;
                }
                iter ++;
            }
        }
        break;
            /* ----------------------------------------------------- */

            /* UniPG>> */
#ifdef USE_JPWL

        case 'W': {         /* activate JPWL correction */
            char *token = NULL;

            token = strtok(opj_optarg, ",");
            while (token != NULL) {

                /* search expected number of components */
                if (*token == 'c') {

                    static int compno;

                    compno = JPWL_EXPECTED_COMPONENTS; /* predefined no. of components */

                    if (sscanf(token, "c=%d", &compno) == 1) {
                        /* Specified */
                        if ((compno < 1) || (compno > 256)) {
                            fprintf(stderr, "ERROR -> invalid number of components c = %d\n", compno);
                            return 1;
                        }
                        parameters->jpwl_exp_comps = compno;

                    } else if (!strcmp(token, "c")) {
                        /* default */
                        parameters->jpwl_exp_comps = compno; /* auto for default size */

                    } else {
                        fprintf(stderr, "ERROR -> invalid components specified = %s\n", token);
                        return 1;
                    };
                }

                /* search maximum number of tiles */
                if (*token == 't') {

                    static int tileno;

                    tileno = JPWL_MAXIMUM_TILES; /* maximum no. of tiles */

                    if (sscanf(token, "t=%d", &tileno) == 1) {
                        /* Specified */
                        if ((tileno < 1) || (tileno > JPWL_MAXIMUM_TILES)) {
                            fprintf(stderr, "ERROR -> invalid number of tiles t = %d\n", tileno);
                            return 1;
                        }
                        parameters->jpwl_max_tiles = tileno;

                    } else if (!strcmp(token, "t")) {
                        /* default */
                        parameters->jpwl_max_tiles = tileno; /* auto for default size */

                    } else {
                        fprintf(stderr, "ERROR -> invalid tiles specified = %s\n", token);
                        return 1;
                    };
                }

                /* next token or bust */
                token = strtok(NULL, ",");
            };
            parameters->jpwl_correct = OPJ_TRUE;
            if (!(parameter->quiet)) {
                fprintf(stdout, "JPWL correction capability activated\n");
                fprintf(stdout, "- expecting %d components\n", parameters->jpwl_exp_comps);
            }
        }
        break;
#endif /* USE_JPWL */
        /* <<UniPG */

        /* ----------------------------------------------------- */
        case 'T': { /* Number of threads */
            if (strcmp(opj_optarg, "ALL_CPUS") == 0) {
                parameters->num_threads = opj_get_num_cpus();
                if (parameters->num_threads == 1) {
                    parameters->num_threads = 0;
                }
            } else {
                sscanf(opj_optarg, "%d", &parameters->num_threads);
            }
        }
        break;

        /* ----------------------------------------------------- */

        default:
            fprintf(stderr, "[WARNING] An invalid option has been ignored.\n");
            break;
        }
    } while (c != -1);

    /* check for possible errors */
    if (img_fol->set_imgdir == 1) {
        if (!(parameters->infile[0] == 0)) {
            fprintf(stderr, "[ERROR] options -ImgDir and -i cannot be used together.\n");
            return 1;
        }
        if (img_fol->set_out_format == 0) {
            fprintf(stderr,
                    "[ERROR] When -ImgDir is used, -OutFor <FORMAT> must be used.\n");
            fprintf(stderr, "Only one format allowed.\n"
                    "Valid format are PGM, PPM, PNM, PGX, BMP, TIF, TIFF, RAW, YUV, and TGA.\n");
            return 1;
        }
        if (!((parameters->outfile[0] == 0))) {
            fprintf(stderr, "[ERROR] options -ImgDir and -o cannot be used together.\n");
            return 1;
        }
    } else {
        if ((parameters->infile[0] == 0) || (parameters->outfile[0] == 0)) {
            fprintf(stderr, "[ERROR] Required parameters are missing\n"
                    "Example: %s -i image.j2k -o image.pgm\n", argv[0]);
            fprintf(stderr, "   Help: %s -h\n", argv[0]);
            return 1;
        }
    }

    return 0;
}